

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsTypes.cpp
# Opt level: O0

SmallBuffer * helics::typeConvertComplex(DataType type,double *vals,size_t size)

{
  initializer_list_t init;
  string_view valname;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *pvVar1;
  SmallBuffer *this;
  reference other;
  ulong in_RCX;
  double *in_RDX;
  uint in_ESI;
  SmallBuffer *in_RDI;
  double dVar2;
  complex<double> *in_stack_00000010;
  DataType in_stack_0000001c;
  size_t ii_2;
  json jsonArray;
  json json;
  size_t ii_1;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> cvec_1;
  size_t ii;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> cvec;
  complex<double> cval;
  double *in_stack_fffffffffffffdb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *in_stack_fffffffffffffdc8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffdd0;
  NamedPoint *in_stack_fffffffffffffdd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *u;
  NamedPoint *in_stack_fffffffffffffde0;
  double *in_stack_fffffffffffffde8;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *in_stack_fffffffffffffdf0;
  char *in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe1c;
  SmallBuffer *this_01;
  DataType in_stack_fffffffffffffe3c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  ulong local_190;
  initializer_list<nlohmann::json_abi_v3_11_3::detail::json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
  local_188 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  ulong local_148;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> local_140 [2];
  __sv_type local_108;
  __sv_type local_b0;
  ulong local_a0;
  DataType in_stack_ffffffffffffff78;
  DataType in_stack_ffffffffffffff7c;
  complex<double> local_60;
  long local_50;
  TimeRepresentation<count_time<9,_long>_> local_48;
  baseType local_40;
  double local_38;
  complex<double> local_30;
  ulong local_20;
  
  if ((in_RDX == (double *)0x0) || (in_RCX == 0)) {
    emptyBlock(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78);
  }
  else if (in_RCX == 1) {
    std::complex<double>::complex(&local_30,*in_RDX,in_RDX[1]);
    typeConvert(in_stack_0000001c,in_stack_00000010);
  }
  else {
    pvVar1 = (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)(ulong)in_ESI;
    local_20 = in_RCX;
    switch(pvVar1) {
    case (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)0x0:
    case (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)0x9:
      std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
                ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)0x34d948);
      std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::reserve
                (in_stack_fffffffffffffdf0,(size_type)in_stack_fffffffffffffde8);
      for (local_a0 = 0; local_a0 < local_20; local_a0 = local_a0 + 1) {
        std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
        emplace_back<double_const&,double_const&>
                  ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                   in_stack_fffffffffffffdd0,(double *)in_stack_fffffffffffffdc8,
                   (double *)in_stack_fffffffffffffdc0);
      }
      helicsComplexVectorString_abi_cxx11_(pvVar1);
      local_b0 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffdc0)
      ;
      ValueConverter<std::basic_string_view<char,_std::char_traits<char>_>_>::convert
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffdd8);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffdc0);
      std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::~vector
                ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                 in_stack_fffffffffffffdd0);
      break;
    case (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)0x1:
      local_38 = vectorNorm((double *)in_stack_fffffffffffffdc0,(size_t)in_stack_fffffffffffffdb8);
      ValueConverter<double>::convert((double *)in_stack_fffffffffffffdd8);
      break;
    case (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)0x2:
      dVar2 = vectorNorm((double *)in_stack_fffffffffffffdc0,(size_t)in_stack_fffffffffffffdb8);
      local_50 = (long)dVar2;
      ValueConverter<long>::convert((long *)in_stack_fffffffffffffdd8);
      break;
    case (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)0x3:
      std::complex<double>::complex(&local_60,*in_RDX,in_RDX[1]);
      ValueConverter<std::complex<double>_>::convert((complex<double> *)in_stack_fffffffffffffdd8);
      break;
    case (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)0x4:
    default:
      ValueConverter<double>::convert(in_stack_fffffffffffffde8,(size_t)in_stack_fffffffffffffde0);
      break;
    case (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)0x5:
      pvVar1 = local_140;
      std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
                ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)0x34db68);
      std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::reserve
                (pvVar1,(size_type)in_stack_fffffffffffffde8);
      for (local_148 = 0; local_148 < local_20; local_148 = local_148 + 1) {
        std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
        emplace_back<double_const&,double_const&>
                  ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                   in_stack_fffffffffffffdd0,(double *)in_stack_fffffffffffffdc8,
                   (double *)in_stack_fffffffffffffdc0);
      }
      ValueConverter<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>::
      convert((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
              in_stack_fffffffffffffdd8);
      std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::~vector
                ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                 in_stack_fffffffffffffdd0);
      break;
    case (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)0x6:
      helicsVectorString_abi_cxx11_
                ((double *)in_RDI,CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
      local_108 = std::__cxx11::string::operator_cast_to_basic_string_view
                            (in_stack_fffffffffffffdc0);
      nan("0");
      valname._M_str = (char *)in_stack_fffffffffffffdf0;
      valname._M_len = (size_t)in_stack_fffffffffffffde8;
      NamedPoint::NamedPoint(in_stack_fffffffffffffde0,valname,(double)in_stack_fffffffffffffdd8);
      ValueConverter<helics::NamedPoint>::convert(in_stack_fffffffffffffdd8);
      NamedPoint::~NamedPoint((NamedPoint *)0x34dafb);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffdc0);
      break;
    case (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)0x7:
      vectorNorm((double *)in_stack_fffffffffffffdc0,(size_t)in_stack_fffffffffffffdb8);
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffdd0,(char *)in_stack_fffffffffffffdc8);
      ValueConverter<std::basic_string_view<char,_std::char_traits<char>_>_>::convert
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffdd8);
      break;
    case (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)0x8:
      vectorNorm((double *)in_stack_fffffffffffffdc0,(size_t)in_stack_fffffffffffffdb8);
      TimeRepresentation<count_time<9,_long>_>::TimeRepresentation
                ((TimeRepresentation<count_time<9,_long>_> *)in_stack_fffffffffffffdc0,
                 (double)in_stack_fffffffffffffdb8);
      local_40 = TimeRepresentation<count_time<9,_long>_>::getBaseTimeCode(&local_48);
      ValueConverter<long>::convert((long *)in_stack_fffffffffffffdd8);
      break;
    case (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)0x1e:
      this_01 = in_RDI;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
      typeNameStringRef_abi_cxx11_(in_stack_fffffffffffffe3c);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::
      basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)in_stack_fffffffffffffde0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffdd8);
      this = (SmallBuffer *)
             nlohmann::json_abi_v3_11_3::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
             ::operator[]<char_const>
                       ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                         *)pvVar1,in_stack_fffffffffffffe08);
      u = &local_168;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                   *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                     *)in_stack_fffffffffffffdc0);
      CLI::std::
      initializer_list<nlohmann::json_abi_v3_11_3::detail::json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
      ::initializer_list(local_188);
      init._M_len = (size_type)u;
      init._M_array = (iterator)in_stack_fffffffffffffdd0;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::array(init);
      for (local_190 = 0; local_190 < local_20; local_190 = local_190 + 1) {
        in_stack_fffffffffffffdd0 =
             (basic_string_view<char,_std::char_traits<char>_> *)&local_1b0.field_2;
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::basic_json<const_double_&,_double,_0>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::push_back((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                     *)this_01,
                    (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                     *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                       *)in_stack_fffffffffffffdc0);
      }
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
      other = nlohmann::json_abi_v3_11_3::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
              ::operator[]<char_const>
                        ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          *)pvVar1,in_stack_fffffffffffffe08);
      this_00 = &local_1b0;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                   *)in_stack_fffffffffffffdd0,other);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                     *)this_00);
      fileops::generateJsonString(other,SUB81((ulong)this_00 >> 0x38,0));
      SmallBuffer::SmallBuffer<std::__cxx11::string,void>(this,u);
      std::__cxx11::string::~string(this_00);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                     *)this_00);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                     *)this_00);
    }
  }
  return in_RDI;
}

Assistant:

SmallBuffer typeConvertComplex(DataType type, const double* vals, size_t size)
{
    if ((vals == nullptr) || (size == 0)) {
        return emptyBlock(type, DataType::HELICS_COMPLEX_VECTOR);
    }
    if (size == 1) {
        // treat like a single complex
        return typeConvert(type, std::complex<double>{vals[0], vals[1]});
    }
    switch (type) {
        case DataType::HELICS_DOUBLE:
            return ValueConverter<double>::convert(vectorNorm(vals, size));
        case DataType::HELICS_TIME:
            return ValueConverter<int64_t>::convert(Time(vectorNorm(vals, size)).getBaseTimeCode());
        case DataType::HELICS_INT:
            return ValueConverter<int64_t>::convert(static_cast<int64_t>(vectorNorm(vals, size)));
        case DataType::HELICS_COMPLEX: {
            const std::complex<double> cval(vals[0], vals[1]);
            return ValueConverter<std::complex<double>>::convert(cval);
        }
        case DataType::HELICS_BOOL:
            return ValueConverter<std::string_view>::convert((vectorNorm(vals, size) != 0.0) ? "1" :
                                                                                               "0");
        case DataType::HELICS_STRING:
        case DataType::HELICS_CHAR: {
            std::vector<std::complex<double>> cvec;
            cvec.reserve(size);
            for (size_t ii = 0; ii < size; ++ii) {
                cvec.emplace_back(vals[2 * ii], vals[2 * ii + 1]);
            }
            return ValueConverter<std::string_view>::convert(helicsComplexVectorString(cvec));
        }
        case DataType::HELICS_NAMED_POINT:
            return ValueConverter<NamedPoint>::convert(
                NamedPoint{helicsVectorString(vals, size), std::nan("0")});
        case DataType::HELICS_COMPLEX_VECTOR: {
            std::vector<std::complex<double>> cvec;
            cvec.reserve(size);
            for (size_t ii = 0; ii < size; ++ii) {
                cvec.emplace_back(vals[2 * ii], vals[2 * ii + 1]);
            }
            return ValueConverter<std::vector<std::complex<double>>>::convert(cvec);
        } break;
        case DataType::HELICS_VECTOR:
        default:
            return ValueConverter<double>::convert(vals, size);
        case DataType::HELICS_JSON: {
            nlohmann::json json;
            json["type"] = typeNameStringRef(DataType::HELICS_VECTOR);
            nlohmann::json jsonArray = nlohmann::json::array();
            for (size_t ii = 0; ii < size; ++ii) {
                jsonArray.push_back(vals[ii]);
            }
            json["value"] = std::move(jsonArray);
            return fileops::generateJsonString(json);
        }
    }
}